

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# crn_clusterizer.h
# Opt level: O0

bool __thiscall
crnlib::clusterizer<crnlib::vec<2U,_float>_>::generate_codebook
          (clusterizer<crnlib::vec<2U,_float>_> *this,uint max_size,
          progress_callback_func_ptr pProgress_callback,void *pProgress_data,bool quick)

{
  double dVar1;
  bool bVar2;
  byte bVar3;
  uint uVar4;
  uint uVar5;
  uint uVar6;
  uint uVar7;
  pair<crnlib::vec<2U,_float>,_unsigned_int> *ppVar8;
  uint *puVar9;
  uint new_capacity;
  vq_node *pvVar10;
  undefined8 in_RCX;
  code *in_RDX;
  uint in_ESI;
  clusterizer<crnlib::vec<2U,_float>_> *in_RDI;
  byte in_R8B;
  float fVar11;
  vq_node *node;
  uint i_1;
  int cur_percentage;
  int worst_node_index;
  int prev_percentage;
  uint total_leaves;
  uint weight;
  vec<2U,_float> *v;
  uint i;
  vq_node root;
  double ttsum;
  vq_node *in_stack_fffffffffffffeb8;
  undefined4 in_stack_fffffffffffffec0;
  float in_stack_fffffffffffffec4;
  vec<2U,_float> *in_stack_fffffffffffffec8;
  undefined4 in_stack_fffffffffffffed0;
  undefined4 in_stack_fffffffffffffed4;
  undefined8 in_stack_fffffffffffffee8;
  undefined4 in_stack_fffffffffffffef0;
  undefined4 in_stack_fffffffffffffef4;
  vector<unsigned_int> *pvVar12;
  undefined4 in_stack_ffffffffffffff00;
  float local_f4;
  float local_ec;
  uint local_ac;
  uint local_9c;
  uint local_98;
  vec<2U,_float> local_94;
  uint local_8c;
  pair<crnlib::vec<2U,_float>,_unsigned_int> *local_88;
  uint local_80;
  vec<2U,_float> local_70;
  ulong local_68;
  float local_60;
  double local_38;
  byte local_29;
  undefined8 local_28;
  code *local_20;
  clusterizer<crnlib::vec<2U,_float>_> *this_00;
  bool local_1;
  
  local_29 = in_R8B & 1;
  local_28 = in_RCX;
  local_20 = in_RDX;
  this_00 = in_RDI;
  bVar2 = vector<std::pair<crnlib::vec<2U,_float>,_unsigned_int>_>::empty(&in_RDI->m_training_vecs);
  if (bVar2) {
    return false;
  }
  in_RDI->m_quick = (bool)(local_29 & 1);
  local_38 = 0.0;
  vq_node::vq_node((vq_node *)CONCAT44(in_stack_fffffffffffffec4,in_stack_fffffffffffffec0));
  vector<std::pair<crnlib::vec<2U,_float>,_unsigned_int>_>::size(&in_RDI->m_training_vecs);
  vector<unsigned_int>::reserve
            ((vector<unsigned_int> *)CONCAT44(in_stack_fffffffffffffef4,in_stack_fffffffffffffef0),
             (uint)((ulong)in_stack_fffffffffffffee8 >> 0x20));
  local_80 = 0;
  while( true ) {
    uVar6 = local_80;
    uVar4 = vector<std::pair<crnlib::vec<2U,_float>,_unsigned_int>_>::size(&in_RDI->m_training_vecs)
    ;
    dVar1 = local_38;
    uVar5 = (uint)((ulong)in_stack_fffffffffffffee8 >> 0x20);
    if (uVar4 <= uVar6) break;
    local_88 = vector<std::pair<crnlib::vec<2U,_float>,_unsigned_int>_>::operator[]
                         (&in_RDI->m_training_vecs,local_80);
    ppVar8 = vector<std::pair<crnlib::vec<2U,_float>,_unsigned_int>_>::operator[]
                       (&in_RDI->m_training_vecs,local_80);
    local_8c = ppVar8->second;
    crnlib::operator*(in_stack_fffffffffffffec8,in_stack_fffffffffffffec4);
    vec<2U,_float>::operator+=(&local_70,&local_94);
    local_68 = local_68 + local_8c;
    vector<unsigned_int>::push_back
              ((vector<unsigned_int> *)CONCAT44(in_stack_fffffffffffffec4,in_stack_fffffffffffffec0)
               ,(uint *)in_stack_fffffffffffffeb8);
    fVar11 = vec<2U,_float>::dot((vec<2U,_float> *)
                                 CONCAT44(in_stack_fffffffffffffec4,in_stack_fffffffffffffec0),
                                 &in_stack_fffffffffffffeb8->m_centroid);
    local_38 = (double)(fVar11 * (float)local_8c) + local_38;
    local_80 = local_80 + 1;
  }
  fVar11 = vec<2U,_float>::dot((vec<2U,_float> *)
                               CONCAT44(in_stack_fffffffffffffec4,in_stack_fffffffffffffec0),
                               &in_stack_fffffffffffffeb8->m_centroid);
  local_ec = (float)local_68;
  local_60 = (float)(dVar1 - (double)(fVar11 / local_ec));
  local_f4 = (float)local_68;
  vec<2U,_float>::operator*=(&local_70,1.0 / local_f4);
  vector<crnlib::clusterizer<crnlib::vec<2U,_float>_>::vq_node>::clear
            ((vector<crnlib::clusterizer<crnlib::vec<2U,_float>_>::vq_node> *)
             CONCAT44(in_stack_fffffffffffffec4,in_stack_fffffffffffffec0));
  vector<crnlib::clusterizer<crnlib::vec<2U,_float>_>::vq_node>::reserve
            ((vector<crnlib::clusterizer<crnlib::vec<2U,_float>_>::vq_node> *)
             CONCAT44(in_stack_fffffffffffffef4,in_stack_fffffffffffffef0),uVar5);
  vector<crnlib::clusterizer<crnlib::vec<2U,_float>_>::vq_node>::push_back
            ((vector<crnlib::clusterizer<crnlib::vec<2U,_float>_>::vq_node> *)
             CONCAT44(in_stack_fffffffffffffec4,in_stack_fffffffffffffec0),in_stack_fffffffffffffeb8
            );
  vector<unsigned_int>::resize
            ((vector<unsigned_int> *)CONCAT44(in_stack_fffffffffffffed4,in_stack_fffffffffffffed0),
             (uint)((ulong)in_stack_fffffffffffffec8 >> 0x20),
             SUB81((ulong)in_stack_fffffffffffffec8 >> 0x18,0));
  puVar9 = vector<unsigned_int>::operator[](&in_RDI->m_heap,1);
  *puVar9 = 0;
  in_RDI->m_heap_size = 1;
  in_RDI->m_split_index = 0;
  local_98 = 1;
  pvVar12 = &in_RDI->m_left_children;
  uVar4 = vector<std::pair<crnlib::vec<2U,_float>,_unsigned_int>_>::size(&in_RDI->m_training_vecs);
  vector<unsigned_int>::reserve
            ((vector<unsigned_int> *)CONCAT44(in_stack_fffffffffffffef4,in_stack_fffffffffffffef0),
             uVar5);
  new_capacity = (uint)((ulong)&in_RDI->m_right_children >> 0x20);
  uVar5 = vector<std::pair<crnlib::vec<2U,_float>,_unsigned_int>_>::size(&in_RDI->m_training_vecs);
  vector<unsigned_int>::reserve
            ((vector<unsigned_int> *)CONCAT44(uVar5,in_stack_fffffffffffffef0),new_capacity);
  local_9c = 0xffffffff;
  while( true ) {
    bVar2 = false;
    if (local_98 < in_ESI) {
      bVar2 = in_RDI->m_heap_size != 0;
    }
    if (!bVar2) break;
    vector<unsigned_int>::operator[](&in_RDI->m_heap,1);
    puVar9 = vector<unsigned_int>::operator[](&in_RDI->m_heap,in_RDI->m_heap_size);
    uVar6 = *puVar9;
    puVar9 = vector<unsigned_int>::operator[](&in_RDI->m_heap,1);
    *puVar9 = uVar6;
    in_RDI->m_heap_size = in_RDI->m_heap_size - 1;
    if (in_RDI->m_heap_size != 0) {
      down_heap((clusterizer<crnlib::vec<2U,_float>_> *)CONCAT44(uVar4,in_stack_ffffffffffffff00),
                (uint)((ulong)pvVar12 >> 0x20));
    }
    split_node(this_00,in_ESI);
    local_98 = local_98 + 1;
    if (((local_20 != (code *)0x0) && ((local_98 & 0x3f) == 0)) && (in_ESI != 0)) {
      uVar6 = local_98 * 100 + (in_ESI >> 1);
      uVar7 = uVar6 / in_ESI;
      if ((uVar7 != local_9c) &&
         (bVar3 = (*local_20)(uVar7,local_28,(ulong)uVar6 % (ulong)in_ESI), local_9c = uVar7,
         (bVar3 & 1) == 0)) {
        local_1 = false;
LAB_0018f620:
        vq_node::~vq_node((vq_node *)0x18f62d);
        return local_1;
      }
    }
  }
  vector<crnlib::vec<2U,_float>_>::clear
            ((vector<crnlib::vec<2U,_float>_> *)
             CONCAT44(in_stack_fffffffffffffec4,in_stack_fffffffffffffec0));
  in_RDI->m_overall_variance = 0.0;
  local_ac = 0;
  while (uVar4 = local_ac,
        uVar5 = vector<crnlib::clusterizer<crnlib::vec<2U,_float>_>::vq_node>::size
                          (&in_RDI->m_nodes), uVar4 < uVar5) {
    pvVar10 = vector<crnlib::clusterizer<crnlib::vec<2U,_float>_>::vq_node>::operator[]
                        (&in_RDI->m_nodes,local_ac);
    if (pvVar10->m_left == -1) {
      in_stack_fffffffffffffec4 = (float)vector<crnlib::vec<2U,_float>_>::size(&in_RDI->m_codebook);
      pvVar10->m_codebook_index = (int)in_stack_fffffffffffffec4;
      vector<crnlib::vec<2U,_float>_>::push_back
                ((vector<crnlib::vec<2U,_float>_> *)
                 CONCAT44(in_stack_fffffffffffffec4,in_stack_fffffffffffffec0),
                 &in_stack_fffffffffffffeb8->m_centroid);
      in_RDI->m_overall_variance = pvVar10->m_variance + in_RDI->m_overall_variance;
    }
    local_ac = local_ac + 1;
  }
  vector<unsigned_int>::clear
            ((vector<unsigned_int> *)CONCAT44(in_stack_fffffffffffffec4,in_stack_fffffffffffffec0));
  vector<unsigned_int>::clear
            ((vector<unsigned_int> *)CONCAT44(in_stack_fffffffffffffec4,in_stack_fffffffffffffec0));
  vector<unsigned_int>::clear
            ((vector<unsigned_int> *)CONCAT44(in_stack_fffffffffffffec4,in_stack_fffffffffffffec0));
  local_1 = true;
  goto LAB_0018f620;
}

Assistant:

bool generate_codebook(uint max_size, progress_callback_func_ptr pProgress_callback = NULL, void* pProgress_data = NULL, bool quick = false) {
    if (m_training_vecs.empty())
      return false;

    m_quick = quick;

    double ttsum = 0.0f;

    vq_node root;
    root.m_vectors.reserve(m_training_vecs.size());

    for (uint i = 0; i < m_training_vecs.size(); i++) {
      const VectorType& v = m_training_vecs[i].first;
      const uint weight = m_training_vecs[i].second;

      root.m_centroid += (v * (float)weight);
      root.m_total_weight += weight;
      root.m_vectors.push_back(i);

      ttsum += v.dot(v) * weight;
    }

    root.m_variance = (float)(ttsum - (root.m_centroid.dot(root.m_centroid) / root.m_total_weight));

    root.m_centroid *= (1.0f / root.m_total_weight);

    m_nodes.clear();
    m_nodes.reserve(max_size * 2 + 1);

    m_nodes.push_back(root);

    m_heap.resize(max_size + 1);
    m_heap[1] = 0;
    m_heap_size = 1;

    m_split_index = 0;

    uint total_leaves = 1;

    m_left_children.reserve(m_training_vecs.size() + 1);
    m_right_children.reserve(m_training_vecs.size() + 1);

    int prev_percentage = -1;
    while ((total_leaves < max_size) && (m_heap_size)) {
      int worst_node_index = m_heap[1];

      m_heap[1] = m_heap[m_heap_size];
      m_heap_size--;
      if (m_heap_size)
        down_heap(1);

      split_node(worst_node_index);
      total_leaves++;

      if ((pProgress_callback) && ((total_leaves & 63) == 0) && (max_size)) {
        int cur_percentage = (total_leaves * 100U + (max_size / 2U)) / max_size;
        if (cur_percentage != prev_percentage) {
          if (!(*pProgress_callback)(cur_percentage, pProgress_data))
            return false;

          prev_percentage = cur_percentage;
        }
      }
    }

    m_codebook.clear();

    m_overall_variance = 0.0f;

    for (uint i = 0; i < m_nodes.size(); i++) {
      vq_node& node = m_nodes[i];
      if (node.m_left != -1) {
        CRNLIB_ASSERT(node.m_right != -1);
        continue;
      }

      CRNLIB_ASSERT((node.m_left == -1) && (node.m_right == -1));

      node.m_codebook_index = m_codebook.size();
      m_codebook.push_back(node.m_centroid);

      m_overall_variance += node.m_variance;
    }

    m_heap.clear();
    m_left_children.clear();
    m_right_children.clear();

    return true;
  }